

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-dis.c
# Opt level: O0

ull getbf(bitfield *bf,ull *a,ull *m)

{
  ull uVar1;
  byte bVar2;
  uint local_30;
  int local_2c;
  int i;
  int pos;
  ull res;
  ull *m_local;
  ull *a_local;
  bitfield *bf_local;
  
  _i = 0;
  local_2c = bf->shr;
  for (local_30 = 0; bVar2 = (byte)local_2c, local_30 < 2; local_30 = local_30 + 1) {
    uVar1 = bf_(bf->sbf[(int)local_30].pos,bf->sbf[(int)local_30].len,a,m);
    _i = uVar1 << (bVar2 & 0x3f) | _i;
    local_2c = bf->sbf[(int)local_30].len + local_2c;
  }
  switch(bf->mode) {
  case BF_UNSIGNED:
    break;
  case BF_SIGNED:
    if ((_i & 1L << (bVar2 - 1 & 0x3f)) != 0) {
      _i = _i - (1L << (bVar2 & 0x3f));
    }
    break;
  case BF_SLIGHTLY_SIGNED:
    if (((_i & 1L << (bVar2 - 1 & 0x3f)) != 0) && ((_i & 1L << (bVar2 - 2 & 0x3f)) != 0)) {
      _i = _i - (1L << (bVar2 & 0x3f));
    }
    break;
  case BF_ULTRASIGNED:
    _i = _i - (1L << (bVar2 & 0x3f));
    break;
  case BF_LUT:
    _i = bf->lut[_i];
  }
  return bf->addend + (bf->xorend ^ _i);
}

Assistant:

ull getbf(const struct bitfield *bf, ull *a, ull *m) {
	ull res = 0;
	int pos = bf->shr;
	int i;
	for (i = 0; i < sizeof(bf->sbf) / sizeof(bf->sbf[0]); i++) {
		res |= BF(bf->sbf[i].pos, bf->sbf[i].len) << pos;
		pos += bf->sbf[i].len;
	}
	switch (bf->mode) {
		case BF_UNSIGNED:
			break;
		case BF_SIGNED:
			if (res & 1ull << (pos - 1))
				res -= 1ull << pos;
			break;
		case BF_SLIGHTLY_SIGNED:
			if (res & 1ull << (pos - 1) && res & 1ull << (pos - 2))
				res -= 1ull << pos;
			break;
		case BF_ULTRASIGNED:
			res -= 1ull << pos;
			break;
		case BF_LUT:
			res = bf->lut[res];
			break;
	}
	res ^= bf->xorend;
	res += bf->addend;
	return res;
}